

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

void Abc_AigPrintNode(Abc_Obj_t *pNode)

{
  int iVar1;
  Abc_Obj_t *pObj;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Abc_Obj_t *pNodeR;
  Abc_Obj_t *pNode_local;
  
  pObj = Abc_ObjRegular(pNode);
  iVar1 = Abc_ObjIsCi(pObj);
  if (iVar1 == 0) {
    iVar1 = Abc_AigNodeIsConst(pObj);
    if (iVar1 == 0) {
      pcVar2 = Abc_ObjName(pObj);
      iVar1 = Abc_ObjIsComplement(pNode);
      pcVar4 = "";
      if (iVar1 != 0) {
        pcVar4 = "\'";
      }
      printf("%7s%s",pcVar2,pcVar4);
      printf(" = ");
      pAVar3 = Abc_ObjFanin0(pObj);
      pcVar2 = Abc_ObjName(pAVar3);
      iVar1 = Abc_ObjFaninC0(pObj);
      pcVar4 = "";
      if (iVar1 != 0) {
        pcVar4 = "\'";
      }
      printf("%7s%s",pcVar2,pcVar4);
      printf(" * ");
      pAVar3 = Abc_ObjFanin1(pObj);
      pcVar2 = Abc_ObjName(pAVar3);
      iVar1 = Abc_ObjFaninC1(pObj);
      pcVar4 = "";
      if (iVar1 != 0) {
        pcVar4 = "\'";
      }
      printf("%7s%s",pcVar2,pcVar4);
      printf("\n");
    }
    else {
      iVar1 = Abc_ObjIsComplement(pNode);
      pcVar2 = "";
      if (iVar1 != 0) {
        pcVar2 = "(complemented)";
      }
      printf("Constant 1 %s.\n",pcVar2);
    }
  }
  else {
    pcVar2 = Abc_ObjName(pObj);
    iVar1 = Abc_ObjIsComplement(pNode);
    pcVar4 = "";
    if (iVar1 != 0) {
      pcVar4 = "\'";
    }
    printf("CI %4s%s.\n",pcVar2,pcVar4);
  }
  return;
}

Assistant:

void Abc_AigPrintNode( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNodeR = Abc_ObjRegular(pNode);
    if ( Abc_ObjIsCi(pNodeR) )
    {
        printf( "CI %4s%s.\n", Abc_ObjName(pNodeR), Abc_ObjIsComplement(pNode)? "\'" : "" );
        return;
    }
    if ( Abc_AigNodeIsConst(pNodeR) )
    {
        printf( "Constant 1 %s.\n", Abc_ObjIsComplement(pNode)? "(complemented)" : ""  );
        return;
    }
    // print the node's function
    printf( "%7s%s", Abc_ObjName(pNodeR),                Abc_ObjIsComplement(pNode)? "\'" : "" );
    printf( " = " );
    printf( "%7s%s", Abc_ObjName(Abc_ObjFanin0(pNodeR)), Abc_ObjFaninC0(pNodeR)?     "\'" : "" );
    printf( " * " );
    printf( "%7s%s", Abc_ObjName(Abc_ObjFanin1(pNodeR)), Abc_ObjFaninC1(pNodeR)?     "\'" : "" );
    printf( "\n" );
}